

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraSim.c
# Opt level: O0

void Fra_SmlCheckOutputSavePattern(Fra_Man_t *p,Aig_Obj_t *pObjPo)

{
  int iVar1;
  int iVar2;
  Aig_Obj_t *pAVar3;
  uint *puVar4;
  void *pvVar5;
  void *pvVar6;
  int *pModel;
  int local_38;
  int BestPat;
  int k;
  int i;
  uint *pSims;
  Aig_Obj_t *pObjPi;
  Aig_Obj_t *pFanin;
  Aig_Obj_t *pObjPo_local;
  Fra_Man_t *p_local;
  
  pAVar3 = Aig_ObjFanin0(pObjPo);
  puVar4 = Fra_ObjSim(p->pSml,pAVar3->Id);
  for (BestPat = 0; (BestPat < p->pSml->nWordsTotal && (puVar4[BestPat] == 0));
      BestPat = BestPat + 1) {
  }
  if (p->pSml->nWordsTotal <= BestPat) {
    __assert_fail("i < p->pSml->nWordsTotal",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/fra/fraSim.c"
                  ,0x124,"void Fra_SmlCheckOutputSavePattern(Fra_Man_t *, Aig_Obj_t *)");
  }
  local_38 = 0;
  while ((local_38 < 0x20 && ((puVar4[BestPat] & 1 << ((byte)local_38 & 0x1f)) == 0))) {
    local_38 = local_38 + 1;
  }
  if (local_38 < 0x20) {
    iVar1 = BestPat * 0x20;
    iVar2 = Aig_ManCiNum(p->pManFraig);
    pvVar5 = malloc((long)(iVar2 + 1) << 2);
    for (BestPat = 0; iVar2 = Vec_PtrSize(p->pManAig->vCis), BestPat < iVar2; BestPat = BestPat + 1)
    {
      pvVar6 = Vec_PtrEntry(p->pManAig->vCis,BestPat);
      puVar4 = Fra_ObjSim(p->pSml,*(int *)((long)pvVar6 + 0x24));
      iVar2 = Abc_InfoHasBit(puVar4,iVar1 + local_38);
      *(int *)((long)pvVar5 + (long)BestPat * 4) = iVar2;
    }
    iVar1 = pObjPo->Id;
    iVar2 = Aig_ManCiNum(p->pManAig);
    *(int *)((long)pvVar5 + (long)iVar2 * 4) = iVar1;
    if (p->pManFraig->pData == (void *)0x0) {
      p->pManFraig->pData = pvVar5;
      return;
    }
    __assert_fail("p->pManFraig->pData == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/fra/fraSim.c"
                  ,0x136,"void Fra_SmlCheckOutputSavePattern(Fra_Man_t *, Aig_Obj_t *)");
  }
  __assert_fail("k < 32",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/fra/fraSim.c"
                ,0x129,"void Fra_SmlCheckOutputSavePattern(Fra_Man_t *, Aig_Obj_t *)");
}

Assistant:

void Fra_SmlCheckOutputSavePattern( Fra_Man_t * p, Aig_Obj_t * pObjPo )
{ 
    Aig_Obj_t * pFanin, * pObjPi;
    unsigned * pSims;
    int i, k, BestPat, * pModel;
    // find the word of the pattern
    pFanin = Aig_ObjFanin0(pObjPo);
    pSims = Fra_ObjSim(p->pSml, pFanin->Id);
    for ( i = 0; i < p->pSml->nWordsTotal; i++ )
        if ( pSims[i] )
            break;
    assert( i < p->pSml->nWordsTotal );
    // find the bit of the pattern
    for ( k = 0; k < 32; k++ )
        if ( pSims[i] & (1 << k) )
            break;
    assert( k < 32 );
    // determine the best pattern
    BestPat = i * 32 + k;
    // fill in the counter-example data
    pModel = ABC_ALLOC( int, Aig_ManCiNum(p->pManFraig)+1 );
    Aig_ManForEachCi( p->pManAig, pObjPi, i )
    {
        pModel[i] = Abc_InfoHasBit(Fra_ObjSim(p->pSml, pObjPi->Id), BestPat);
//        printf( "%d", pModel[i] );
    }
    pModel[Aig_ManCiNum(p->pManAig)] = pObjPo->Id;
//    printf( "\n" );
    // set the model
    assert( p->pManFraig->pData == NULL );
    p->pManFraig->pData = pModel;
    return;
}